

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::IFF_Layer2::AddFundamentalParameterData
          (IFF_Layer2 *this,IFF_ATC_NAVAIDS_FundamentalParameterData *FPD)

{
  pointer *ppIVar1;
  KUINT16 *pKVar2;
  iterator __position;
  undefined8 uVar3;
  undefined8 uVar4;
  KFLOAT32 KVar5;
  KFLOAT32 KVar6;
  KFLOAT32 KVar7;
  
  __position._M_current =
       (this->m_vFPD).
       super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vFPD).
      super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>>
    ::_M_realloc_insert<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData_const&>
              ((vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>>
                *)&this->m_vFPD,__position,FPD);
  }
  else {
    ((__position._M_current)->super_DataTypeBase)._vptr_DataTypeBase =
         (_func_int **)&PTR__IFF_ATC_NAVAIDS_FundamentalParameterData_00232ba8;
    KVar5 = FPD->m_f32Freq;
    KVar6 = FPD->m_f32PgRF;
    KVar7 = FPD->m_f32PulseWidth;
    uVar3 = *(undefined8 *)((long)&FPD->m_f32PgRF + 1);
    uVar4 = *(undefined8 *)((long)&FPD->m_ui32BurstLength + 1);
    (__position._M_current)->m_f32ERP = FPD->m_f32ERP;
    (__position._M_current)->m_f32Freq = KVar5;
    (__position._M_current)->m_f32PgRF = KVar6;
    (__position._M_current)->m_f32PulseWidth = KVar7;
    *(undefined8 *)((long)&(__position._M_current)->m_f32PgRF + 1) = uVar3;
    *(undefined8 *)((long)&(__position._M_current)->m_ui32BurstLength + 1) = uVar4;
    ppIVar1 = &(this->m_vFPD).
               super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  pKVar2 = &(this->super_LayerHeader).m_ui16LayerLength;
  *pKVar2 = *pKVar2 + 0x18;
  SecondaryOperationalData::SetNumberOfFundamentalParamSets
            (&this->m_SOD,
             (char)((uint)(*(int *)&(this->m_vFPD).
                                    super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->m_vFPD).
                                   super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33);
  return;
}

Assistant:

void IFF_Layer2::AddFundamentalParameterData( const IFF_ATC_NAVAIDS_FundamentalParameterData & FPD )
{
    m_vFPD.push_back( FPD );
    m_ui16LayerLength += IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FUNDAMENTAL_PARAMETER_SIZE;
    m_SOD.SetNumberOfFundamentalParamSets( m_vFPD.size() );
}